

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O2

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::
rt_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>
          (rt_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
          *other)

{
  auto_ptr_ref<const_viennamath::rt_expression_interface<double>_> __ref;
  
  *(undefined8 *)this = 0;
  __ref._M_ptr = (rt_expression_interface<double> *)operator_new(0x20);
  rt_binary_expr<viennamath::rt_expression_interface<double>>::
  rt_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,1ul>
            ((rt_binary_expr<viennamath::rt_expression_interface<double>> *)__ref._M_ptr,other);
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)this,__ref);
  return;
}

Assistant:

rt_expr(ct_binary_expr<LHS, OP, RHS> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_binary_expr<InterfaceType>(other));
      }